

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ast.h
# Opt level: O2

Node * __thiscall wabt::AST::InsertNode(AST *this,NodeType ntype,ExprType etype,Expr *e,Index nargs)

{
  vector<wabt::Node,_std::allocator<wabt::Node>_> *__result;
  Node *__last;
  const_iterator __last_00;
  pointer pNVar1;
  ulong __n;
  Node local_50;
  
  __n = (ulong)nargs;
  if (__n <= (ulong)(((long)(this->exp_stack).
                            super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(this->exp_stack).
                           super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
                           super__Vector_impl_data._M_start) / 0x30)) {
    __result = &local_50.children;
    local_50.children.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_50.children.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_50.children.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_50.u.var = (Var *)0x0;
    local_50.ntype = ntype;
    local_50.etype = etype;
    local_50.e = e;
    std::vector<wabt::Node,_std::allocator<wabt::Node>_>::reserve(__result,__n);
    __last = (this->exp_stack).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
             super__Vector_impl_data._M_finish;
    std::__copy_move<true,false,std::random_access_iterator_tag>::
    __copy_m<wabt::Node*,std::back_insert_iterator<std::vector<wabt::Node,std::allocator<wabt::Node>>>>
              (__last + -__n,__last,
               (back_insert_iterator<std::vector<wabt::Node,_std::allocator<wabt::Node>_>_>)__result
              );
    __last_00._M_current =
         (this->exp_stack).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
         super__Vector_impl_data._M_finish;
    std::vector<wabt::Node,_std::allocator<wabt::Node>_>::erase
              (&this->exp_stack,__last_00._M_current + -__n,__last_00);
    std::vector<wabt::Node,_std::allocator<wabt::Node>_>::emplace_back<wabt::Node>
              (&this->exp_stack,&local_50);
    pNVar1 = (this->exp_stack).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
             super__Vector_impl_data._M_finish;
    std::vector<wabt::Node,_std::allocator<wabt::Node>_>::~vector(__result);
    return pNVar1 + -1;
  }
  __assert_fail("exp_stack.size() >= nargs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/decompiler-ast.h"
                ,0x5f,"Node &wabt::AST::InsertNode(NodeType, ExprType, const Expr *, Index)");
}

Assistant:

Node& InsertNode(NodeType ntype, ExprType etype, const Expr* e, Index nargs) {
    assert(exp_stack.size() >= nargs);
    Node n { ntype, etype, e, nullptr };
    n.children.reserve(nargs);
    std::move(exp_stack.end() - nargs, exp_stack.end(),
              std::back_inserter(n.children));
    exp_stack.erase(exp_stack.end() - nargs, exp_stack.end());
    exp_stack.push_back(std::move(n));
    return exp_stack.back();
  }